

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdafx.cpp
# Opt level: O0

char * NULLC::defaultFileLoad(char *name,uint *size)

{
  FILE *__stream;
  long lVar1;
  size_t sVar2;
  uint read;
  char *fileContent;
  FILE *file;
  uint *size_local;
  char *name_local;
  
  if (name == (char *)0x0) {
    __assert_fail("name",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/stdafx.cpp"
                  ,0x36,"const char *NULLC::defaultFileLoad(const char *, unsigned int *)");
  }
  if (size != (uint *)0x0) {
    __stream = fopen(name,"rb");
    if (__stream == (FILE *)0x0) {
      *size = 0;
      name_local = (char *)0x0;
    }
    else {
      fseek(__stream,0,2);
      lVar1 = ftell(__stream);
      *size = (uint)lVar1;
      fseek(__stream,0,0);
      name_local = (char *)(*(code *)alloc)(*size + 1);
      sVar2 = fread(name_local,1,(ulong)*size,__stream);
      if ((uint)sVar2 == *size) {
        name_local[*size] = '\0';
        fclose(__stream);
      }
      else {
        (*(code *)dealloc)(name_local);
        *size = 0;
        fclose(__stream);
        name_local = (char *)0x0;
      }
    }
    return name_local;
  }
  __assert_fail("size",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/stdafx.cpp"
                ,0x37,"const char *NULLC::defaultFileLoad(const char *, unsigned int *)");
}

Assistant:

const char* NULLC::defaultFileLoad(const char* name, unsigned* size)
{
	assert(name);
	assert(size);

	FILE *file = fopen(name, "rb");
	if(file)
	{
		fseek(file, 0, SEEK_END);
		*size = ftell(file);
		fseek(file, 0, SEEK_SET);
		char *fileContent = (char*)NULLC::alloc(*size + 1);
		unsigned read = (unsigned)fread(fileContent, 1, *size, file);

		if(read != *size)
		{
			NULLC::dealloc(fileContent);
			*size = 0;

			fclose(file);
			return NULL;
		}

		fileContent[*size] = 0;
		fclose(file);
		return fileContent;
	}
	*size = 0;
	return NULL;
}